

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O2

CalculateGrowingBlockSizeResult
qCalculateGrowingBlockSize(qsizetype elementCount,qsizetype elementSize,qsizetype headerSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t allocSize;
  CalculateGrowingBlockSizeResult CVar8;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = elementSize;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = elementCount;
  uVar3 = SUB168(auVar1 * auVar2,0);
  lVar6 = -1;
  lVar5 = lVar6;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    uVar7 = uVar3 + headerSize;
    if ((!CARRY8(uVar3,headerSize)) && (-1 < (long)uVar7)) {
      lVar6 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      allocSize = 1;
      if (uVar7 != 0) {
        allocSize = 2L << ((byte)lVar6 & 0x3f);
      }
      if ((long)allocSize < 0) {
        allocSize = (allocSize - uVar7 >> 1) + uVar7;
      }
      sVar4 = QtPrivate::expectedAllocSize(allocSize,0x10);
      if (sVar4 == 0) {
        sVar4 = allocSize;
      }
      lVar5 = (long)(sVar4 - headerSize) / elementSize;
      lVar6 = lVar5 * elementSize + headerSize;
    }
  }
  CVar8.elementCount = lVar5;
  CVar8.size = lVar6;
  return CVar8;
}

Assistant:

CalculateGrowingBlockSizeResult
qCalculateGrowingBlockSize(qsizetype elementCount, qsizetype elementSize, qsizetype headerSize) noexcept
{
    CalculateGrowingBlockSizeResult result = {
        qsizetype(-1), qsizetype(-1)
    };

    qsizetype bytes = qCalculateBlockSize(elementCount, elementSize, headerSize);
    if (bytes < 0)
        return result;

    size_t morebytes = static_cast<size_t>(qNextPowerOfTwo(quint64(bytes)));
    if (Q_UNLIKELY(qsizetype(morebytes) < 0)) {
        // grow by half the difference between bytes and morebytes
        // this slows the growth and avoids trying to allocate exactly
        // 2G of memory (on 32bit), something that many OSes can't deliver
        bytes += (morebytes - bytes) / 2;
    } else {
        bytes = qsizetype(morebytes);
    }
    size_t fittedBytes = QtPrivate::expectedAllocSize(bytes, alignof(std::max_align_t));
    if (fittedBytes != 0)
        bytes = fittedBytes;

    result.elementCount = (bytes - headerSize) / elementSize;
    result.size = result.elementCount * elementSize + headerSize;
    return result;
}